

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O0

void __thiscall
lzham::raw_quasi_adaptive_huffman_data_model::clear(raw_quasi_adaptive_huffman_data_model *this)

{
  vector<unsigned_short> *in_RDI;
  
  vector<unsigned_short>::clear(in_RDI);
  vector<unsigned_short>::clear(in_RDI);
  vector<unsigned_char>::clear((vector<unsigned_char> *)in_RDI);
  in_RDI[3].m_capacity = 0;
  in_RDI[3].m_size = 0;
  *(undefined4 *)&in_RDI[4].m_p = 0;
  *(undefined4 *)((long)&in_RDI[4].m_p + 4) = 0;
  *(undefined1 *)&in_RDI[4].m_capacity = 0;
  in_RDI[4].m_size = 0;
  if (in_RDI[3].m_p != (unsigned_short *)0x0) {
    lzham_delete<lzham::prefix_coding::decoder_tables>((decoder_tables *)0x13c865);
    in_RDI[3].m_p = (unsigned_short *)0x0;
  }
  *(undefined1 *)((long)&in_RDI[4].m_capacity + 2) = 0;
  *(undefined1 *)((long)&in_RDI[4].m_capacity + 3) = 0;
  return;
}

Assistant:

void raw_quasi_adaptive_huffman_data_model::clear()
   {
      m_sym_freq.clear();
      m_codes.clear();
      m_code_sizes.clear();

      m_max_cycle = 0;
      m_total_syms = 0;
      m_update_cycle = 0;
      m_symbols_until_update = 0;
      m_decoder_table_bits = 0;
      m_total_count = 0;

      if (m_pDecode_tables)
      {
         lzham_delete(m_pDecode_tables);
         m_pDecode_tables = NULL;
      }

      m_fast_updating = false;
      m_use_polar_codes = false;
   }